

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int av1_handle_intra_y_mode
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,uint ref_frame_cost,PICK_MODE_CONTEXT *ctx,RD_STATS *rd_stats_y,int64_t best_rd,
              int *mode_cost_y,int64_t *rd_y,int64_t *best_model_rd,int64_t *top_intra_model_rd)

{
  bool bVar1;
  int iVar2;
  int mode_cost_00;
  int iVar3;
  int iVar4;
  AV1_COMMON *cm_00;
  MACROBLOCK *x_00;
  int64_t this_model_rd_00;
  BLOCK_SIZE in_CL;
  MACROBLOCK *in_RDX;
  long in_RSI;
  long in_RDI;
  float in_R8D;
  uint8_t *in_R9;
  RD_STATS *in_stack_00000008;
  long in_stack_00000010;
  int *in_stack_00000018;
  long *in_stack_00000020;
  int rate_y;
  int tmp_rate;
  int64_t best_rd_so_far;
  int try_filter_intra;
  int model_rd_index_for_pruning;
  int64_t this_model_rd;
  TX_SIZE tx_size;
  int is_chroma;
  float thresh [4];
  int is_directional_mode;
  int64_t known_rd;
  int intra_cost_penalty;
  int known_rate;
  int skip_ctx;
  int mode_cost;
  ModeCosts *mode_costs;
  PREDICTION_MODE mode;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  INTRA_MODE_SPEED_FEATURES *intra_sf;
  AV1_COMMON *cm;
  int in_stack_0000077c;
  RD_STATS *in_stack_00000780;
  PICK_MODE_CONTEXT *in_stack_00000788;
  BLOCK_SIZE in_stack_00000797;
  MACROBLOCK *in_stack_00000798;
  AV1_COMP *in_stack_000007a0;
  int64_t in_stack_000007b0;
  int64_t in_stack_000007b8;
  undefined8 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int local_d0;
  int local_c4;
  int64_t in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  BLOCK_SIZE bs;
  undefined2 in_stack_ffffffffffffff80;
  TX_SIZE in_stack_ffffffffffffff82;
  BLOCK_SIZE in_stack_ffffffffffffff83;
  BLOCK_SIZE bsize_00;
  MB_MODE_INFO *mbmi_00;
  undefined7 in_stack_ffffffffffffffa8;
  byte mode_00;
  AV1_COMP *cpi_00;
  BLOCK_SIZE in_stack_ffffffffffffffde;
  int local_4;
  
  cm_00 = (AV1_COMMON *)(in_RSI + 0x3bf80);
  cpi_00 = (AV1_COMP *)*(in_RDX->e_mbd).mi;
  mode_00 = *(byte *)((long)&cpi_00->ppi + 2);
  mbmi_00 = (MB_MODE_INFO *)&in_RDX->mode_costs;
  iVar2 = (in_RDX->mode_costs).mbmode_cost[""[in_CL]][mode_00] + (int)in_R8D;
  mode_cost_00 = av1_get_skip_txfm_context(&in_RDX->e_mbd);
  iVar4 = iVar2;
  iVar3 = av1_get_intra_cost_penalty
                    (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (aom_bit_depth_t)in_stack_ffffffffffffff18);
  bsize_00 = (BLOCK_SIZE)((uint)iVar4 >> 0x18);
  if ((mode_00 != 0) && (mode_00 != 0xc)) {
    iVar2 = iVar3 + iVar2;
  }
  if (*(int *)(mbmi_00[0x6c].ref_frame + (long)mode_cost_00 * 8) <
      *(int *)(mbmi_00[0x6c].ref_frame + (long)mode_cost_00 * 8 + 4)) {
    local_c4 = *(int *)(mbmi_00[0x6c].ref_frame + (long)mode_cost_00 * 8);
  }
  else {
    local_c4 = *(int *)(mbmi_00[0x6c].ref_frame + (long)mode_cost_00 * 8 + 4);
  }
  local_c4 = local_c4 + iVar2;
  x_00 = (MACROBLOCK *)((long)local_c4 * (long)in_RDX->rdmult + 0x100 >> 9);
  if (in_stack_00000010 < (long)x_00) {
    *(undefined4 *)(in_RDI + 4) = 1;
    local_4 = 0;
  }
  else {
    iVar4 = av1_is_directional_mode(mode_00);
    if (((iVar4 != 0) && (iVar2 = av1_use_angle_delta(in_CL), iVar2 != 0)) &&
       ((*(byte *)(in_RSI + 0x426ee) & 1) != 0)) {
      if ((*(int *)(in_RSI + 0x60b88) != 0) && (*(int *)(in_RDI + 0x18) == 0)) {
        in_stack_ffffffffffffff70 = 0x3f99999a00000000;
        prune_intra_mode_with_hog
                  (in_RDX,in_CL,in_stack_ffffffffffffffde,in_R8D,in_R9,(int)((ulong)cm_00 >> 0x20));
        *(undefined4 *)(in_RDI + 0x18) = 1;
      }
      if (*(char *)(in_RDI + 8 + (ulong)mode_00) != '\0') {
        return 0;
      }
    }
    this_model_rd_00 =
         intra_model_rd((AV1_COMMON *)CONCAT44(local_c4,iVar3),x_00,iVar4,in_stack_ffffffffffffff83,
                        in_stack_ffffffffffffff82,in_stack_ffffffffffffff7c);
    bs = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff7c >> 0x18);
    iVar2 = get_model_rd_index_for_pruning(in_RDX,(INTRA_MODE_SPEED_FEATURES *)(in_RSI + 0x60b5c));
    iVar2 = prune_intra_y_mode(this_model_rd_00,_rate_y,(int64_t *)best_rd_so_far,
                               *(int *)(in_RSI + 0x60bb0),iVar2);
    if (iVar2 == 0) {
      av1_init_rd_stats(in_stack_00000008);
      av1_pick_uniform_tx_size_type_yrd
                ((AV1_COMP *)CONCAT44(local_c4,iVar3),x_00,
                 (RD_STATS *)
                 CONCAT44(iVar4,CONCAT13(in_stack_ffffffffffffff83,
                                         CONCAT12(in_stack_ffffffffffffff82,
                                                  in_stack_ffffffffffffff80))),bs,
                 in_stack_ffffffffffffff70);
      if ((mode_00 == 0) && (iVar4 = av1_filter_intra_allowed_bsize(cm_00,in_CL), iVar4 != 0)) {
        if (in_stack_00000008->rate == 0x7fffffff) {
          bVar1 = *(int *)(in_RSI + 0x60bc0) < 1;
        }
        else {
          *(undefined1 *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[4] + 0xb) = 0;
          iVar4 = in_stack_00000008->rate;
          iVar3 = intra_mode_info_cost_y
                            (cpi_00,(MACROBLOCK *)CONCAT17(mode_00,in_stack_ffffffffffffffa8),
                             mbmi_00,bsize_00,mode_cost_00,local_c4);
          bVar1 = (((long)(iVar4 + iVar3) * (long)in_RDX->rdmult + 0x100 >> 9) +
                  in_stack_00000008->dist * 0x80) / 2 <= in_stack_00000010;
        }
        if (bVar1) {
          handle_filter_intra_mode
                    (in_stack_000007a0,in_stack_00000798,in_stack_00000797,in_stack_00000788,
                     in_stack_00000780,in_stack_0000077c,in_stack_000007b0,in_stack_000007b8);
        }
      }
      if (in_stack_00000008->rate == 0x7fffffff) {
        local_4 = 0;
      }
      else {
        iVar4 = intra_mode_info_cost_y
                          (cpi_00,(MACROBLOCK *)CONCAT17(mode_00,in_stack_ffffffffffffffa8),mbmi_00,
                           bsize_00,mode_cost_00,local_c4);
        *in_stack_00000018 = iVar4;
        if (in_stack_00000008->skip_txfm == '\0') {
          local_d0 = in_stack_00000008->rate;
        }
        else {
          local_d0 = *(int *)(mbmi_00[0x6c].ref_frame + (long)mode_cost_00 * 8 + 4);
        }
        *in_stack_00000020 =
             ((long)(local_d0 + *in_stack_00000018) * (long)in_RDX->rdmult + 0x100 >> 9) +
             in_stack_00000008->dist * 0x80;
        if ((in_stack_00000010 < 0x3fffffffffffffff) &&
           (in_stack_00000010 + (in_stack_00000010 >> 2) < *in_stack_00000020)) {
          *(undefined4 *)(in_RDI + 4) = 1;
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int av1_handle_intra_y_mode(IntraModeSearchState *intra_search_state,
                            const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                            const PICK_MODE_CONTEXT *ctx, RD_STATS *rd_stats_y,
                            int64_t best_rd, int *mode_cost_y, int64_t *rd_y,
                            int64_t *best_model_rd,
                            int64_t top_intra_model_rd[]) {
  const AV1_COMMON *cm = &cpi->common;
  const INTRA_MODE_SPEED_FEATURES *const intra_sf = &cpi->sf.intra_sf;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->ref_frame[0] == INTRA_FRAME);
  const PREDICTION_MODE mode = mbmi->mode;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]][mode] + ref_frame_cost;
  const int skip_ctx = av1_get_skip_txfm_context(xd);

  int known_rate = mode_cost;
  const int intra_cost_penalty = av1_get_intra_cost_penalty(
      cm->quant_params.base_qindex, cm->quant_params.y_dc_delta_q,
      cm->seq_params->bit_depth);

  if (mode != DC_PRED && mode != PAETH_PRED) known_rate += intra_cost_penalty;
  known_rate += AOMMIN(mode_costs->skip_txfm_cost[skip_ctx][0],
                       mode_costs->skip_txfm_cost[skip_ctx][1]);
  const int64_t known_rd = RDCOST(x->rdmult, known_rate, 0);
  if (known_rd > best_rd) {
    intra_search_state->skip_intra_modes = 1;
    return 0;
  }

  const int is_directional_mode = av1_is_directional_mode(mode);
  if (is_directional_mode && av1_use_angle_delta(bsize) &&
      cpi->oxcf.intra_mode_cfg.enable_angle_delta) {
    if (intra_sf->intra_pruning_with_hog &&
        !intra_search_state->dir_mode_skip_mask_ready) {
      const float thresh[4] = { -1.2f, 0.0f, 0.0f, 1.2f };
      const int is_chroma = 0;
      prune_intra_mode_with_hog(x, bsize, cm->seq_params->sb_size,
                                thresh[intra_sf->intra_pruning_with_hog - 1],
                                intra_search_state->directional_mode_skip_mask,
                                is_chroma);
      intra_search_state->dir_mode_skip_mask_ready = 1;
    }
    if (intra_search_state->directional_mode_skip_mask[mode]) return 0;
  }
  const TX_SIZE tx_size = AOMMIN(TX_32X32, max_txsize_lookup[bsize]);
  const int64_t this_model_rd =
      intra_model_rd(&cpi->common, x, 0, bsize, tx_size, /*use_hadamard=*/1);

  const int model_rd_index_for_pruning =
      get_model_rd_index_for_pruning(x, intra_sf);

  if (prune_intra_y_mode(this_model_rd, best_model_rd, top_intra_model_rd,
                         intra_sf->top_intra_model_count_allowed,
                         model_rd_index_for_pruning))
    return 0;
  av1_init_rd_stats(rd_stats_y);
  av1_pick_uniform_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, best_rd);

  // Pick filter intra modes.
  if (mode == DC_PRED && av1_filter_intra_allowed_bsize(cm, bsize)) {
    int try_filter_intra = 1;
    int64_t best_rd_so_far = INT64_MAX;
    if (rd_stats_y->rate != INT_MAX) {
      // best_rd_so_far is the rdcost of DC_PRED without using filter_intra.
      // Later, in filter intra search, best_rd_so_far is used for comparison.
      mbmi->filter_intra_mode_info.use_filter_intra = 0;
      const int tmp_rate =
          rd_stats_y->rate +
          intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
      best_rd_so_far = RDCOST(x->rdmult, tmp_rate, rd_stats_y->dist);
      try_filter_intra = (best_rd_so_far / 2) <= best_rd;
    } else if (intra_sf->skip_filter_intra_in_inter_frames >= 1) {
      // As rd cost of luma intra dc mode is more than best_rd (i.e.,
      // rd_stats_y->rate = INT_MAX), skip the evaluation of filter intra modes.
      try_filter_intra = 0;
    }

    if (try_filter_intra) {
      handle_filter_intra_mode(cpi, x, bsize, ctx, rd_stats_y, mode_cost,
                               best_rd, best_rd_so_far);
    }
  }

  if (rd_stats_y->rate == INT_MAX) return 0;

  *mode_cost_y = intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
  const int rate_y = rd_stats_y->skip_txfm
                         ? mode_costs->skip_txfm_cost[skip_ctx][1]
                         : rd_stats_y->rate;
  *rd_y = RDCOST(x->rdmult, rate_y + *mode_cost_y, rd_stats_y->dist);
  if (best_rd < (INT64_MAX / 2) && *rd_y > (best_rd + (best_rd >> 2))) {
    intra_search_state->skip_intra_modes = 1;
    return 0;
  }

  return 1;
}